

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vloc.cc
# Opt level: O0

ostream * tchecker::output(ostream *os,vloc_t *vloc,system_t *system)

{
  vloc_t *pvVar1;
  element_type *this;
  string *psVar2;
  pointer local_38;
  const_iterator_t it;
  const_iterator_t end;
  const_iterator_t begin;
  system_t *system_local;
  vloc_t *vloc_local;
  ostream *os_local;
  
  begin = (const_iterator_t)system;
  system_local = (system_t *)vloc;
  vloc_local = (vloc_t *)os;
  end = make_array_t<unsigned_int,_4UL,_tchecker::vloc_base_t>::begin(&vloc->super_loc_array_t);
  it = make_array_t<unsigned_int,_4UL,_tchecker::vloc_base_t>::end
                 ((make_array_t<unsigned_int,_4UL,_tchecker::vloc_base_t> *)system_local);
  std::operator<<((ostream *)vloc_local,"<");
  for (local_38 = (pointer)end; local_38 != (pointer)it;
      local_38 = (pointer)((long)&(local_38->
                                  super___shared_ptr<tchecker::system::loc_t,_(__gnu_cxx::_Lock_policy)2>
                                  )._M_ptr + 4)) {
    if (local_38 != (pointer)end) {
      std::operator<<((ostream *)vloc_local,",");
    }
    pvVar1 = vloc_local;
    tchecker::system::locs_t::location((locs_t *)&stack0xffffffffffffffb8,(int)begin + 0x230);
    this = std::
           __shared_ptr_access<const_tchecker::system::loc_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<const_tchecker::system::loc_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&stack0xffffffffffffffb8);
    psVar2 = tchecker::system::loc_t::name_abi_cxx11_(this);
    std::operator<<((ostream *)pvVar1,(string *)psVar2);
    std::shared_ptr<const_tchecker::system::loc_t>::~shared_ptr
              ((shared_ptr<const_tchecker::system::loc_t> *)&stack0xffffffffffffffb8);
  }
  std::operator<<((ostream *)vloc_local,">");
  return (ostream *)vloc_local;
}

Assistant:

std::ostream & output(std::ostream & os, tchecker::vloc_t const & vloc, tchecker::system::system_t const & system)
{
  auto begin = vloc.begin(), end = vloc.end();
  os << "<";
  for (auto it = begin; it != end; ++it) {
    if (it != begin)
      os << ",";
    os << system.location(*it)->name();
  }
  os << ">";
  return os;
}